

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O0

Vector2D __thiscall
CGL::SceneObjects::EnvironmentLight::dir_to_theta_phi(EnvironmentLight *this,Vector3D *dir)

{
  Vector2D *in_RDI;
  double x;
  double dVar1;
  Vector2D VVar2;
  double phi;
  double theta;
  Vector3D unit_dir;
  Vector3D *in_stack_ffffffffffffffb8;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  Vector3D::unit(in_stack_ffffffffffffffb8);
  x = acos(local_30);
  dVar1 = atan2(-local_28,local_38);
  dVar1 = dVar1 + 3.141592653589793;
  Vector2D::Vector2D(in_RDI,x,dVar1);
  VVar2.y = dVar1;
  VVar2.x = x;
  return VVar2;
}

Assistant:

Vector2D EnvironmentLight::dir_to_theta_phi(const Vector3D dir) const {
    Vector3D unit_dir = dir.unit();
    double theta = acos(unit_dir.y);
    double phi = atan2(-unit_dir.z, unit_dir.x) + PI;
    return Vector2D(theta, phi);
  }